

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

void arkPrintMem(ARKodeMem ark_mem,FILE *outfile)

{
  ARKodeHAdaptMem in_RSI;
  void *in_RDI;
  FILE *in_stack_ffffffffffffffe8;
  
  fprintf((FILE *)in_RSI,"itol = %i\n",(ulong)*(uint *)((long)in_RDI + 0x18));
  fprintf((FILE *)in_RSI,"ritol = %i\n",(ulong)*(uint *)((long)in_RDI + 0x1c));
  fprintf((FILE *)in_RSI,"mxhnil = %i\n",(ulong)*(uint *)((long)in_RDI + 0x1c0));
  fprintf((FILE *)in_RSI,"mxstep = %li\n",*(undefined8 *)((long)in_RDI + 0x1b8));
  fprintf((FILE *)in_RSI,"lrw1 = %li\n",(long)*(int *)((long)in_RDI + 0x210));
  fprintf((FILE *)in_RSI,"liw1 = %li\n",(long)*(int *)((long)in_RDI + 0x214));
  fprintf((FILE *)in_RSI,"lrw = %li\n",*(undefined8 *)((long)in_RDI + 0x218));
  fprintf((FILE *)in_RSI,"liw = %li\n",*(undefined8 *)((long)in_RDI + 0x220));
  fprintf((FILE *)in_RSI,"user_efun = %i\n",(ulong)*(uint *)((long)in_RDI + 0x54));
  fprintf((FILE *)in_RSI,"tstopset = %i\n",(ulong)*(uint *)((long)in_RDI + 0x150));
  fprintf((FILE *)in_RSI,"tstop = %.16g\n",*(undefined8 *)((long)in_RDI + 0x158));
  fprintf((FILE *)in_RSI,"report = %i\n",(ulong)*(uint *)((long)in_RDI + 0x200));
  fprintf((FILE *)in_RSI,"VabstolMallocDone = %i\n",(ulong)*(uint *)((long)in_RDI + 0x248));
  fprintf((FILE *)in_RSI,"MallocDone = %i\n",(ulong)*(uint *)((long)in_RDI + 0x250));
  fprintf((FILE *)in_RSI,"initsetup = %i\n",(ulong)*(uint *)((long)in_RDI + 0x254));
  fprintf((FILE *)in_RSI,"init_type = %i\n",(ulong)*(uint *)((long)in_RDI + 600));
  fprintf((FILE *)in_RSI,"firststage = %i\n",(ulong)*(uint *)((long)in_RDI + 0x25c));
  fprintf((FILE *)in_RSI,"uround = %.16g\n",*(undefined8 *)((long)in_RDI + 8));
  fprintf((FILE *)in_RSI,"reltol = %.16g\n",*(undefined8 *)((long)in_RDI + 0x20));
  fprintf((FILE *)in_RSI,"Sabstol = %.16g\n",*(undefined8 *)((long)in_RDI + 0x28));
  fprintf((FILE *)in_RSI,"fixedstep = %i\n",(ulong)*(uint *)((long)in_RDI + 0x1a8));
  fprintf((FILE *)in_RSI,"tolsf = %.16g\n",*(undefined8 *)((long)in_RDI + 0x240));
  fprintf((FILE *)in_RSI,"call_fullrhs = %i\n",(ulong)*(uint *)((long)in_RDI + 0x264));
  fprintf((FILE *)in_RSI,"nhnil = %i\n",(ulong)*(uint *)((long)in_RDI + 0x1e0));
  fprintf((FILE *)in_RSI,"nst_attempts = %li\n",*(undefined8 *)((long)in_RDI + 0x1d0));
  fprintf((FILE *)in_RSI,"nst = %li\n",*(undefined8 *)((long)in_RDI + 0x1d8));
  fprintf((FILE *)in_RSI,"ncfn = %li\n",*(undefined8 *)((long)in_RDI + 0x1e8));
  fprintf((FILE *)in_RSI,"netf = %li\n",*(undefined8 *)((long)in_RDI + 0x1f0));
  fprintf((FILE *)in_RSI,"hin = %.16g\n",*(undefined8 *)((long)in_RDI + 0x160));
  fprintf((FILE *)in_RSI,"h = %.16g\n",*(undefined8 *)((long)in_RDI + 0x168));
  fprintf((FILE *)in_RSI,"hprime = %.16g\n",*(undefined8 *)((long)in_RDI + 0x180));
  fprintf((FILE *)in_RSI,"next_h = %.16g\n",*(undefined8 *)((long)in_RDI + 0x188));
  fprintf((FILE *)in_RSI,"eta = %.16g\n",*(undefined8 *)((long)in_RDI + 400));
  fprintf((FILE *)in_RSI,"tcur = %.16g\n",*(undefined8 *)((long)in_RDI + 0x198));
  fprintf((FILE *)in_RSI,"tretlast = %.16g\n",*(undefined8 *)((long)in_RDI + 0x1a0));
  fprintf((FILE *)in_RSI,"hmin = %.16g\n",*(undefined8 *)((long)in_RDI + 0x170));
  fprintf((FILE *)in_RSI,"hmax_inv = %.16g\n",*(undefined8 *)((long)in_RDI + 0x178));
  fprintf((FILE *)in_RSI,"h0u = %.16g\n",*(undefined8 *)((long)in_RDI + 0x228));
  fprintf((FILE *)in_RSI,"tn = %.16g\n",*(undefined8 *)((long)in_RDI + 0x230));
  fprintf((FILE *)in_RSI,"hold = %.16g\n",*(undefined8 *)((long)in_RDI + 0x238));
  fprintf((FILE *)in_RSI,"maxnef = %i\n",(ulong)*(uint *)((long)in_RDI + 0x1c8));
  fprintf((FILE *)in_RSI,"maxncf = %i\n",(ulong)*(uint *)((long)in_RDI + 0x1cc));
  fprintf((FILE *)in_RSI,"timestep adaptivity structure:\n");
  arkPrintAdaptMem(in_RSI,in_stack_ffffffffffffffe8);
  fprintf((FILE *)in_RSI,"constraintsSet = %i\n",(ulong)*(uint *)((long)in_RDI + 0x80));
  fprintf((FILE *)in_RSI,"maxconstrfails = %i\n",(ulong)*(uint *)((long)in_RDI + 0x1c4));
  if (*(long *)((long)in_RDI + 0x280) != 0) {
    arkPrintRootMem(in_RDI,(FILE *)in_RSI);
  }
  arkInterpPrintMem((ARKInterp)in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void arkPrintMem(ARKodeMem ark_mem, FILE *outfile)
{
  /* output general values */
  fprintf(outfile, "itol = %i\n", ark_mem->itol);
  fprintf(outfile, "ritol = %i\n", ark_mem->ritol);
  fprintf(outfile, "mxhnil = %i\n", ark_mem->mxhnil);
  fprintf(outfile, "mxstep = %li\n", ark_mem->mxstep);
  fprintf(outfile, "lrw1 = %li\n", (long int) ark_mem->lrw1);
  fprintf(outfile, "liw1 = %li\n", (long int) ark_mem->liw1);
  fprintf(outfile, "lrw = %li\n", (long int) ark_mem->lrw);
  fprintf(outfile, "liw = %li\n", (long int) ark_mem->liw);
  fprintf(outfile, "user_efun = %i\n", ark_mem->user_efun);
  fprintf(outfile, "tstopset = %i\n", ark_mem->tstopset);
  fprintf(outfile, "tstop = %" RSYM"\n", ark_mem->tstop);
  fprintf(outfile, "report = %i\n", ark_mem->report);
  fprintf(outfile, "VabstolMallocDone = %i\n", ark_mem->VabstolMallocDone);
  fprintf(outfile, "MallocDone = %i\n", ark_mem->MallocDone);
  fprintf(outfile, "initsetup = %i\n", ark_mem->initsetup);
  fprintf(outfile, "init_type = %i\n", ark_mem->init_type);
  fprintf(outfile, "firststage = %i\n", ark_mem->firststage);
  fprintf(outfile, "uround = %" RSYM"\n", ark_mem->uround);
  fprintf(outfile, "reltol = %" RSYM"\n", ark_mem->reltol);
  fprintf(outfile, "Sabstol = %" RSYM"\n", ark_mem->Sabstol);
  fprintf(outfile, "fixedstep = %i\n", ark_mem->fixedstep);
  fprintf(outfile, "tolsf = %" RSYM"\n", ark_mem->tolsf);
  fprintf(outfile, "call_fullrhs = %i\n", ark_mem->call_fullrhs);

  /* output counters */
  fprintf(outfile, "nhnil = %i\n", ark_mem->nhnil);
  fprintf(outfile, "nst_attempts = %li\n", ark_mem->nst_attempts);
  fprintf(outfile, "nst = %li\n", ark_mem->nst);
  fprintf(outfile, "ncfn = %li\n", ark_mem->ncfn);
  fprintf(outfile, "netf = %li\n", ark_mem->netf);

  /* output time-stepping values */
  fprintf(outfile, "hin = %" RSYM"\n", ark_mem->hin);
  fprintf(outfile, "h = %" RSYM"\n", ark_mem->h);
  fprintf(outfile, "hprime = %" RSYM"\n", ark_mem->hprime);
  fprintf(outfile, "next_h = %" RSYM"\n", ark_mem->next_h);
  fprintf(outfile, "eta = %" RSYM"\n", ark_mem->eta);
  fprintf(outfile, "tcur = %" RSYM"\n", ark_mem->tcur);
  fprintf(outfile, "tretlast = %" RSYM"\n", ark_mem->tretlast);
  fprintf(outfile, "hmin = %" RSYM"\n", ark_mem->hmin);
  fprintf(outfile, "hmax_inv = %" RSYM"\n", ark_mem->hmax_inv);
  fprintf(outfile, "h0u = %" RSYM"\n", ark_mem->h0u);
  fprintf(outfile, "tn = %" RSYM"\n", ark_mem->tn);
  fprintf(outfile, "hold = %" RSYM"\n", ark_mem->hold);
  fprintf(outfile, "maxnef = %i\n", ark_mem->maxnef);
  fprintf(outfile, "maxncf = %i\n", ark_mem->maxncf);

  /* output time-stepping adaptivity structure */
  fprintf(outfile, "timestep adaptivity structure:\n");
  arkPrintAdaptMem(ark_mem->hadapt_mem, outfile);

  /* output inequality constraints quantities */
  fprintf(outfile, "constraintsSet = %i\n", ark_mem->constraintsSet);
  fprintf(outfile, "maxconstrfails = %i\n", ark_mem->maxconstrfails);

  /* output root-finding quantities */
  if (ark_mem->root_mem != NULL)
    (void) arkPrintRootMem((void*) ark_mem, outfile);

  /* output interpolation quantities */
  arkInterpPrintMem(ark_mem->interp, outfile);

#ifdef SUNDIALS_DEBUG_PRINTVEC
  /* output vector quantities */
  fprintf(outfile, "Vapbsol:\n");
  N_VPrintFile(ark_mem->Vabstol, outfile);
  fprintf(outfile, "ewt:\n");
  N_VPrintFile(ark_mem->ewt, outfile);
  if (!ark_mem->rwt_is_ewt) {
    fprintf(outfile, "rwt:\n");
    N_VPrintFile(ark_mem->rwt, outfile);
  }
  fprintf(outfile, "ycur:\n");
  N_VPrintFile(ark_mem->ycur, outfile);
  fprintf(outfile, "yn:\n");
  N_VPrintFile(ark_mem->yn, outfile);
  fprintf(outfile, "fn:\n");
  N_VPrintFile(ark_mem->fn, outfile);
  fprintf(outfile, "tempv1:\n");
  N_VPrintFile(ark_mem->tempv1, outfile);
  fprintf(outfile, "tempv2:\n");
  N_VPrintFile(ark_mem->tempv2, outfile);
  fprintf(outfile, "tempv3:\n");
  N_VPrintFile(ark_mem->tempv3, outfile);
  fprintf(outfile, "tempv4:\n");
  N_VPrintFile(ark_mem->tempv4, outfile);
  fprintf(outfile, "constraints:\n");
  N_VPrintFile(ark_mem->constraints, outfile);
#endif

}